

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O2

Am_Value __thiscall Am_Load_Save_Context::Load(Am_Load_Save_Context *this,istream *is)

{
  Map<int,_Wrapper_Holder,_std::less<int>_> *this_00;
  Wrapper_Holder initial;
  undefined4 aKey;
  bool bVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long *plVar3;
  istream *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value aVar4;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_02;
  Wrapper_Holder *this_01;
  Am_Load_Method AVar5;
  Am_Value AVar6;
  char ch;
  int number;
  int base;
  char type_name [100];
  char local_c9;
  undefined1 local_c8 [8];
  undefined1 local_c0 [24];
  Map<int,_Wrapper_Holder,_std::less<int>_> *local_a8;
  undefined4 local_a0;
  Wrapper_Holder local_98;
  
  if (*(long *)is == 0) {
    Am_Error("Load called on a (0L) load/save context");
  }
  std::operator>>(in_RDX,&local_c9);
  initial = No_Wrapper;
  switch((int)local_c9 - 0x44U >> 1 | (uint)(((int)local_c9 - 0x44U & 1) != 0) << 0x1f) {
  case 0:
    plVar3 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)local_c8);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      *(undefined4 *)(*(long *)is + 0x40) = local_c8._0_4_;
      pbVar2 = std::operator>>(in_RDX,(char *)&local_98);
      if (((byte)pbVar2[*(long *)(*(long *)pbVar2 + -0x18) + 0x20] & 5) == 0) {
        local_a8 = (Map<int,_Wrapper_Holder,_std::less<int>_> *)&local_98;
        AVar5 = OpenAmulet::Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_>::GetAt
                          (*(Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_> **)
                            (*(long *)is + 0x10),(char **)(local_c0 + 0x18));
        if (AVar5.Call != (Am_Load_Method_Type *)0x0) {
          (*AVar5.Call)((istream *)this,(Am_Load_Save_Context *)in_RDX);
          bVar1 = Am_Value::Valid((Am_Value *)this);
          aVar4 = extraout_RDX;
          if ((!bVar1) || (((ulong)this->data & 0x7000) != 0x2000)) goto LAB_00228182;
          this_00 = *(Map<int,_Wrapper_Holder,_std::less<int>_> **)(*(long *)is + 0x30);
          aKey = local_c8._0_4_;
          local_c0._16_8_ = Am_Value::operator_cast_to_Am_Wrapper_((Am_Value *)this);
          OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::SetAt
                    (this_00,aKey,(Wrapper_Holder *)(local_c0 + 0x10));
          this_01 = (Wrapper_Holder *)(local_c0 + 0x10);
          goto LAB_00228260;
        }
      }
    }
    break;
  case 5:
    if (No_Wrapper.data != (Am_Wrapper *)0x0) {
      (No_Wrapper.data)->refs = (No_Wrapper.data)->refs + 1;
    }
    Am_Value::Am_Value((Am_Value *)this,initial.data);
    aVar4 = extraout_RDX_00;
    goto LAB_00228182;
  case 6:
    pbVar2 = std::operator>>(in_RDX,(char *)&local_98);
    if (((byte)pbVar2[*(long *)(*(long *)pbVar2 + -0x18) + 0x20] & 5) == 0) {
      std::istream::get((char *)in_RDX);
      local_c8 = (undefined1  [8])0x0;
      if (local_c9 == ' ') {
        plVar3 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)(local_c0 + 0xc));
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
          local_a0 = local_c0._12_4_;
          local_a8 = (Map<int,_Wrapper_Holder,_std::less<int>_> *)&local_98;
          OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                    ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_c0,
                     *(Name_Num **)(*(long *)is + 0x20));
          goto LAB_00228219;
        }
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      }
      else {
        local_a0 = 0xffffffff;
        local_a8 = (Map<int,_Wrapper_Holder,_std::less<int>_> *)&local_98;
        OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                  ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_c0,
                   *(Name_Num **)(*(long *)is + 0x20));
LAB_00228219:
        local_c8 = (undefined1  [8])local_c0._0_8_;
        if ((Am_Wrapper *)local_c0._0_8_ != (Am_Wrapper *)0x0) {
          *(uint *)(local_c0._0_8_ + 8) = *(uint *)(local_c0._0_8_ + 8) + 1;
        }
        Wrapper_Holder::~Wrapper_Holder((Wrapper_Holder *)local_c0);
        if (local_c8 == (undefined1  [8])0x0) {
          Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
        }
        else {
          *(uint *)((long)local_c8 + 8) = *(uint *)((long)local_c8 + 8) + 1;
          Am_Value::Am_Value((Am_Value *)this,(Am_Wrapper *)local_c8);
        }
      }
      this_01 = (Wrapper_Holder *)local_c8;
LAB_00228260:
      Wrapper_Holder::~Wrapper_Holder(this_01);
      aVar4 = extraout_RDX_02;
      goto LAB_00228182;
    }
    break;
  case 7:
    plVar3 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)(*(long *)is + 0x40));
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::GetAt
                ((Map<int,_Wrapper_Holder,_std::less<int>_> *)&local_98,
                 *(int **)(*(long *)is + 0x30));
      if (local_98.data == (Am_Wrapper *)0x0) {
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      }
      else {
        (local_98.data)->refs = (local_98.data)->refs + 1;
        Am_Value::Am_Value((Am_Value *)this,local_98.data);
      }
      this_01 = &local_98;
      goto LAB_00228260;
    }
  }
  Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
  aVar4 = extraout_RDX_01;
LAB_00228182:
  AVar6.value.wrapper_value = aVar4.wrapper_value;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

Am_Value
Am_Load_Save_Context::Load(std::istream &is)
{
  if (!data) {
    Am_Error("Load called on a (0L) load/save context");
  }

  // operator >> will skip whitespace
  char ch;
  is >> ch;

  // check what type we have
  switch (ch) {
  case 'D': {
    // read in the number
    int number;
    if (!(is >> number)) {
      // ups, there is none...
      return Am_No_Value;
    }
    data->counter = number;

    // read in the type name
    char type_name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> type_name)) {
      return Am_No_Value;
    }

    // get the loader-method for the given type-name by asking the
    // map which stores the type-name/loader-method pairs
    Am_Load_Method method = data->loader->GetAt(type_name);

    // did we received a valid method-pointer?
    if (method.Valid() == false) {
      // no
      return Am_No_Value;
    }

    // yes, than read the value
    Am_Value value = method.Call(is, *this);

    // check to see if all types are the same
    if (value.Valid() && Am_Type_Class(value.type) == Am_WRAPPER) {
      data->wrappers->SetAt(number, Wrapper_Holder(value));
    }

    // and return the found value
    return (value);
  }

  case 'R': {
    if (!(is >> data->counter))
      return Am_No_Value;
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    Wrapper_Holder value = data->wrappers->GetAt(data->counter);
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  case 'N': {
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    return Am_Value(No_Wrapper);
  }

  case 'P': {
    char name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> name))
      return Am_No_Value;
    is.get(ch); // will be space or (part of) EOLN
    Wrapper_Holder value;
    if (ch == ' ') {
      int base;
      if (!(is >> base))
        return Am_No_Value;
      value = data->prototypes->GetAt(Name_Num(name, base));
      // is.get (ch); // skip eoln
      // if (ch != '\n') return Am_No_Value;
    } else
      value = data->prototypes->GetAt(Name_Num(name));
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  default: {
    // no known type found...
    return (Am_No_Value);
  }
  }
}